

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_archive_comment.c
# Opt level: O3

char * zip_get_archive_comment(zip_t *za,int *lenp,zip_flags_t flags)

{
  zip_uint8_t *pzVar1;
  zip_string_t *string;
  zip_uint32_t len;
  zip_uint32_t local_c;
  
  if (((flags & 8) != 0) || (string = za->comment_changes, string == (zip_string_t *)0x0)) {
    string = za->comment_orig;
  }
  pzVar1 = _zip_string_get(string,&local_c,flags,&za->error);
  if (lenp != (int *)0x0 && pzVar1 != (zip_uint8_t *)0x0) {
    *lenp = local_c;
  }
  return (char *)pzVar1;
}

Assistant:

ZIP_EXTERN const char *
zip_get_archive_comment(zip_t *za, int *lenp, zip_flags_t flags) {
    zip_string_t *comment;
    zip_uint32_t len;
    const zip_uint8_t *str;

    if ((flags & ZIP_FL_UNCHANGED) || (za->comment_changes == NULL))
        comment = za->comment_orig;
    else
        comment = za->comment_changes;

    if ((str = _zip_string_get(comment, &len, flags, &za->error)) == NULL)
        return NULL;

    if (lenp)
        *lenp = (int)len;

    return (const char *)str;
}